

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InstancedExpansionShader::shadePrimitives
          (InstancedExpansionShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  GeometryEmitter *this_00;
  ulong uVar1;
  float __x;
  float fVar2;
  Vec4 centerPosition;
  Vec4 basePosition;
  Vector<float,_4> local_98;
  GeometryEmitter *local_80;
  PrimitivePacket *local_78;
  InstancedExpansionShader *local_70;
  ulong local_68;
  tcu local_60 [16];
  tcu local_50 [16];
  Vector<float,_4> local_40;
  
  uVar1 = 0;
  local_68 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_68 = uVar1;
  }
  local_68 = local_68 * 0x38;
  local_80 = output;
  local_78 = packets;
  local_70 = this;
  for (; local_68 != uVar1; uVar1 = uVar1 + 0x38) {
    tcu::Vector<float,_4>::Vector
              (&local_40,(Vector<float,_4> *)(*(long *)((long)packets->vertices + uVar1) + 8));
    __x = ((float)invocationID / (float)*(int *)&(local_70->super_ShaderProgram).field_0x154) * 6.3;
    fVar2 = cosf(__x);
    local_98.m_data[1] = sinf(__x);
    local_98.m_data[0] = fVar2;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    tcu::operator*(local_60,0.1,&local_98);
    tcu::operator+(local_50,&local_40,(Vector<float,_4> *)local_60);
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = -0.1;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    tcu::operator+(local_60,(Vector<float,_4> *)local_50,&local_98);
    this_00 = local_80;
    rr::GeometryEmitter::EmitVertex
              (local_80,(Vec4 *)local_60,0.0,(GenericVec4 *)0x0,
               *(int *)((long)packets->vertices + (uVar1 - 8)));
    local_98.m_data[0] = -0.05;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    tcu::operator+(local_60,(Vector<float,_4> *)local_50,&local_98);
    rr::GeometryEmitter::EmitVertex
              (this_00,(Vec4 *)local_60,0.0,(GenericVec4 *)0x0,
               *(int *)((long)packets->vertices + (uVar1 - 8)));
    local_98.m_data[0] = 0.05;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    tcu::operator+(local_60,(Vector<float,_4> *)local_50,&local_98);
    rr::GeometryEmitter::EmitVertex
              (this_00,(Vec4 *)local_60,0.0,(GenericVec4 *)0x0,
               *(int *)((long)packets->vertices + (uVar1 - 8)));
    rr::GeometryEmitter::EndPrimitive(this_00);
  }
  return;
}

Assistant:

void InstancedExpansionShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex			= packets[packetNdx].vertices[0];
		const tcu::Vec4			basePosition	= vertex->position;
		const float				phase			= float(invocationID) / float(m_numInvocations) * 6.3f;
		const tcu::Vec4			centerPosition	= basePosition + tcu::Vec4(deFloatCos(phase), deFloatSin(phase), 0.0f, 0.0f) * 0.1f;

		output.EmitVertex(centerPosition + tcu::Vec4( 0.0f,  -0.1f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EmitVertex(centerPosition + tcu::Vec4(-0.05f,  0.0f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EmitVertex(centerPosition + tcu::Vec4( 0.05f,  0.0f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EndPrimitive();
	}
}